

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# topten.c
# Opt level: O0

void update_topten(int how,char *dumpname)

{
  boolean bVar1;
  int fd_00;
  int fd;
  boolean need_rewrite;
  toptenentry newtt;
  toptenentry *toptenlist;
  char *dumpname_local;
  int how_local;
  
  if (program_state.panicking == 0) {
    end_how = how;
    fill_topten_entry((toptenentry *)&fd,how);
    update_log((toptenentry *)&fd);
    update_xlog((toptenentry *)&fd,dumpname);
    if ((flags.debug == '\0') && (flags.explore == '\0')) {
      fd_00 = open_datafile("record",0x42,2);
      bVar1 = lock_fd(fd_00,0x1e);
      if (bVar1 == '\0') {
        close(fd_00);
      }
      else {
        newtt.death._92_8_ = read_topten(fd_00,10000);
        bVar1 = toptenlist_insert((toptenentry *)newtt.death._92_8_,(toptenentry *)&fd);
        if (bVar1 != '\0') {
          write_topten(fd_00,(toptenentry *)newtt.death._92_8_);
        }
        unlock_fd(fd_00);
        close(fd_00);
        free((void *)newtt.death._92_8_);
      }
    }
  }
  return;
}

Assistant:

void update_topten(int how, const char *dumpname)
{
    struct toptenentry *toptenlist, newtt;
    boolean need_rewrite;
    int  fd;

    if (program_state.panicking)
	return;

    end_how = how; /* save how for nh_get_topten */

    fill_topten_entry(&newtt, how);
    update_log(&newtt);
    update_xlog(&newtt, dumpname);

    /* nothing more to do for non-scoring games */
    if (wizard || discover)
	return;

    fd = open_datafile(RECORD, O_RDWR | O_CREAT, SCOREPREFIX);
    if (!lock_fd(fd, 30)) {
	close(fd);
	return;
    }

    toptenlist = read_topten(fd, TTLISTLEN);

    /* possibly rearrange the score list to include the new entry */
    need_rewrite = toptenlist_insert(toptenlist, &newtt);
    if (need_rewrite)
	write_topten(fd, toptenlist);

    unlock_fd(fd);
    close(fd);
    free(toptenlist);
}